

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormulaTransformer.cpp
# Opt level: O0

FormulaUnit * __thiscall
Kernel::LocalFormulaUnitTransformer::transform(LocalFormulaUnitTransformer *this,FormulaUnit *unit)

{
  Formula *pFVar1;
  Formula *pFVar2;
  FormulaUnit *in_RSI;
  long *in_RDI;
  Formula *newForm;
  Formula *f;
  FormulaClauseTransformation *in_stack_ffffffffffffff68;
  FormulaClauseTransformation local_68;
  Inference *in_stack_ffffffffffffffb0;
  Formula *in_stack_ffffffffffffffb8;
  FormulaUnit *in_stack_ffffffffffffffc0;
  FormulaUnit *local_8;
  
  pFVar1 = FormulaUnit::formula(in_RSI);
  pFVar2 = (Formula *)(**(code **)(*in_RDI + 0x18))(in_RDI,pFVar1);
  local_8 = in_RSI;
  if (pFVar1 != pFVar2) {
    local_8 = (FormulaUnit *)FormulaUnit::operator_new(0x8595e6);
    FormulaClauseTransformation::FormulaClauseTransformation
              (&local_68,*(InferenceRule *)(in_RDI + 1),&in_RSI->super_Unit);
    Inference::Inference((Inference *)local_8,in_stack_ffffffffffffff68);
    FormulaUnit::FormulaUnit
              (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
    Inference::~Inference((Inference *)&stack0xffffffffffffffa8);
  }
  return local_8;
}

Assistant:

FormulaUnit* LocalFormulaUnitTransformer::transform(FormulaUnit* unit)
{
  Formula* f = unit->formula();
  Formula* newForm = transform(f);
  if(f==newForm) {
    return unit;
  }
  return new FormulaUnit(newForm, FormulaClauseTransformation(_rule, unit));
}